

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void duckdb_fmt::v6::internal::check_pointer_type_spec<char,duckdb_fmt::v6::internal::error_handler>
               (char spec,error_handler *eh)

{
  long *plVar1;
  size_type *psVar2;
  int iVar3;
  undefined7 in_register_00000039;
  string local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  iVar3 = (int)CONCAT71(in_register_00000039,spec);
  if ((iVar3 != 0) && (iVar3 != 0x70)) {
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_58,'\x01');
    std::operator+(&local_38,"Invalid type specifier \"",&local_58);
    plVar1 = (long *)std::__cxx11::string::append((char *)&local_38);
    local_78._M_dataplus._M_p = (pointer)*plVar1;
    psVar2 = (size_type *)(plVar1 + 2);
    if ((size_type *)local_78._M_dataplus._M_p == psVar2) {
      local_78.field_2._M_allocated_capacity = *psVar2;
      local_78.field_2._8_8_ = plVar1[3];
      local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    }
    else {
      local_78.field_2._M_allocated_capacity = *psVar2;
    }
    local_78._M_string_length = plVar1[1];
    *plVar1 = (long)psVar2;
    plVar1[1] = 0;
    *(undefined1 *)(plVar1 + 2) = 0;
    error_handler::on_error(eh,&local_78);
  }
  return;
}

Assistant:

FMT_CONSTEXPR void check_pointer_type_spec(Char spec, ErrorHandler&& eh) {
  if (spec != 0 && spec != 'p') eh.on_error("Invalid type specifier \"" + std::string(1, spec) + "\" for formatting a value of type pointer");
}